

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O3

FT_Error FT_Stroker_GetCounts(FT_Stroker stroker,FT_UInt *anum_points,FT_UInt *anum_contours)

{
  FT_Error FVar1;
  FT_UInt local_40;
  FT_UInt local_3c;
  FT_UInt count3;
  FT_UInt count4;
  FT_UInt count1;
  FT_UInt count2;
  
  if (stroker == (FT_Stroker)0x0) {
    FVar1 = 6;
    local_40 = 0;
    local_3c = 0;
  }
  else {
    ft_stroke_border_get_counts(stroker->borders,&count3,&count4);
    ft_stroke_border_get_counts(stroker->borders + 1,&local_40,&local_3c);
    local_40 = local_40 + count3;
    local_3c = local_3c + count4;
    FVar1 = 0;
  }
  if (anum_points != (FT_UInt *)0x0) {
    *anum_points = local_40;
  }
  if (anum_contours != (FT_UInt *)0x0) {
    *anum_contours = local_3c;
  }
  return FVar1;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_GetCounts( FT_Stroker  stroker,
                        FT_UInt    *anum_points,
                        FT_UInt    *anum_contours )
  {
    FT_UInt   count1, count2, num_points   = 0;
    FT_UInt   count3, count4, num_contours = 0;
    FT_Error  error;


    if ( !stroker )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    error = ft_stroke_border_get_counts( stroker->borders + 0,
                                         &count1, &count2 );
    if ( error )
      goto Exit;

    error = ft_stroke_border_get_counts( stroker->borders + 1,
                                         &count3, &count4 );
    if ( error )
      goto Exit;

    num_points   = count1 + count3;
    num_contours = count2 + count4;

  Exit:
    if ( anum_points )
      *anum_points   = num_points;

    if ( anum_contours )
      *anum_contours = num_contours;

    return error;
  }